

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_deflate(archive *a,la_zstream *lastrm,la_zaction action)

{
  undefined8 *puVar1;
  uint uVar2;
  int in_EDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  int r;
  z_stream *strm;
  int local_4;
  
  puVar1 = (undefined8 *)in_RSI[9];
  *puVar1 = *in_RSI;
  *(undefined4 *)(puVar1 + 1) = *(undefined4 *)(in_RSI + 1);
  puVar1[2] = in_RSI[2];
  puVar1[3] = in_RSI[3];
  *(undefined4 *)(puVar1 + 4) = *(undefined4 *)(in_RSI + 4);
  puVar1[5] = in_RSI[5];
  uVar2 = deflate(puVar1,(ulong)(in_EDX == 0) << 2);
  *in_RSI = *puVar1;
  in_RSI[1] = (ulong)*(uint *)(puVar1 + 1);
  in_RSI[2] = puVar1[2];
  in_RSI[3] = puVar1[3];
  in_RSI[4] = (ulong)*(uint *)(puVar1 + 4);
  in_RSI[5] = puVar1[5];
  if (uVar2 == 0) {
    local_4 = 0;
  }
  else if (uVar2 == 1) {
    local_4 = 1;
  }
  else {
    archive_set_error(in_RDI,-1,"GZip compression failed: deflate() call returned status %d",
                      (ulong)uVar2);
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
compression_code_deflate(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	r = deflate(strm,
	    (action == ARCHIVE_Z_FINISH)? Z_FINISH: Z_NO_FLUSH);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case Z_OK:
		return (ARCHIVE_OK);
	case Z_STREAM_END:
		return (ARCHIVE_EOF);
	default:
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "GZip compression failed:"
		    " deflate() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}